

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.h
# Opt level: O0

void __thiscall BackupRestaurant::~BackupRestaurant(BackupRestaurant *this)

{
  BackupRestaurant *this_local;
  
  BaseAction::~BaseAction(&this->super_BaseAction);
  return;
}

Assistant:

virtual  ~BackupRestaurant() = default;